

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void __thiscall TempFile::~TempFile(TempFile *this)

{
  char *__filename;
  string *in_RDI;
  
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

TempFile::~TempFile() {
  std::remove(name_.c_str());
}